

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O2

int Sbm_ManCreateCnf(Sbm_Man_t *p)

{
  sat_solver *psVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_00;
  ulong uVar7;
  Vec_Int_t *in_RSI;
  long lVar8;
  ulong uVar9;
  Vec_Int_t *p_01;
  uint uVar10;
  int i;
  int Lits [2];
  int local_3c;
  Vec_Int_t *local_38;
  
  iVar3 = Sbm_ManCheckSol(p,in_RSI);
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = p->FirstVar;
    iVar4 = sat_solver_nvars(p->pSat);
    if (iVar3 != iVar4) {
      __assert_fail("p->FirstVar == sat_solver_nvars(p->pSat)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                    ,0x9d,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
    }
    psVar1 = p->pSat;
    iVar3 = sat_solver_nvars(psVar1);
    sat_solver_setnvars(psVar1,iVar3 + p->vCuts->nSize);
    p_01 = (Vec_Int_t *)0x0;
    for (uVar10 = 0; (int)uVar10 < p->vObjCuts->nSize; uVar10 = uVar10 + 1) {
      p_00 = Vec_WecEntry(p->vObjCuts,uVar10);
      if ((long)p_00->nSize < 2) {
        __assert_fail("Vec_IntSize(vLits) >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                      ,0xa3,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
      }
      iVar3 = sat_solver_addclause(p->pSat,p_00->pArray,p_00->pArray + p_00->nSize);
      if (iVar3 == 0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                      ,0xa5,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
      }
      if ((uVar10 & 1) != 0) {
        iVar3 = Vec_IntEntryLast(p_00);
        Lits[0] = Abc_LitNot(iVar3);
        iVar3 = Vec_IntEntryLast(p_01);
        Lits[1] = Abc_LitNot(iVar3);
        iVar3 = sat_solver_addclause(p->pSat,Lits,&local_3c);
        if (iVar3 == 0) {
          __assert_fail("value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                        ,0xba,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
        }
      }
      p_01 = p_00;
    }
    iVar4 = 0;
    iVar3 = 1;
    while( true ) {
      if (p->vCuts->nSize <= iVar4) break;
      local_38 = Vec_WecEntry(p->vCuts,iVar4);
      local_3c = iVar4;
      for (i = 0; i < local_38->nSize; i = i + 1) {
        iVar5 = Vec_IntEntry(local_38,i);
        iVar6 = Abc_Lit2Var(iVar5);
        if (p->nInputs < iVar6) {
          Lits[0] = Abc_Var2Lit(iVar5 - p->LitShift,0);
          Lits[1] = Abc_Var2Lit(p->FirstVar + iVar4,1);
          iVar5 = sat_solver_addclause(p->pSat,Lits,&local_3c);
          if (iVar5 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                          ,0xcf,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
          }
        }
        else {
          if (i == 0) {
            __assert_fail("k > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                          ,0xc4,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
          }
          iVar6 = p->vObjCuts->nSize;
          iVar5 = Abc_Lit2Var(iVar5);
          iVar4 = local_3c;
          Lits[0] = Abc_Var2Lit(iVar5 + iVar6 + -1,0);
          Lits[1] = Abc_Var2Lit(p->FirstVar + iVar4,1);
          iVar5 = sat_solver_addclause(p->pSat,Lits,&local_3c);
          if (iVar5 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                          ,200,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
          }
        }
      }
      iVar4 = iVar4 + 1;
    }
    psVar1 = p->pSat;
    piVar2 = p->vPolar->pArray;
    uVar10 = p->vPolar->nSize;
    for (lVar8 = 0; lVar8 < psVar1->size; lVar8 = lVar8 + 1) {
      psVar1->polarity[lVar8] = '\0';
    }
    uVar9 = 0;
    uVar7 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar7 = uVar9;
    }
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      psVar1->polarity[piVar2[uVar9]] = '\x01';
    }
  }
  return iVar3;
}

Assistant:

int Sbm_ManCreateCnf( Sbm_Man_t * p )
{
    int i, k, Lit, Lits[2], value;
    Vec_Int_t * vLits, * vCutOne, * vLitsPrev;
    // sat_solver_rollback( p->Sat );
    if ( !Sbm_ManCheckSol(p, p->vSolCuts) )
        return 0;
    // increase var count
    assert( p->FirstVar == sat_solver_nvars(p->pSat) );
    sat_solver_setnvars( p->pSat, sat_solver_nvars(p->pSat) + Vec_WecSize(p->vCuts) );
    // iterate over arrays containing obj-lit cuts (neg-obj-lit cut-lits followed by pos-obj-lit cut-lits)
    vLitsPrev = NULL;
    Vec_WecForEachLevel( p->vObjCuts, vLits, i )
    {
        assert( Vec_IntSize(vLits) >= 2 );
        value = sat_solver_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits)  );
        assert( value );
/*
        // for each cut, add implied nodes
        Lits[0] = Abc_LitNot( Vec_IntEntry(vLits, 0) );
        assert( Lits[0] < 2*p->FirstVar );
        Vec_IntForEachEntryStart( vLits, Lit, k, 1 )
        {
            assert( Lit >= 2*p->FirstVar );
            Lits[1] = Abc_LitNot( Lit );
            value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
            assert( value );
            //printf( "Adding clause %d + %d.\n", Lits[0], Lits[1]-2*p->FirstVar );
        }
*/
        //printf( "\n" );
        // create invertor exclusivity clause
        if ( i & 1 )
        {
            Lits[0] = Abc_LitNot( Vec_IntEntryLast(vLits) );
            Lits[1] = Abc_LitNot( Vec_IntEntryLast(vLitsPrev) );
            value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
            assert( value );
            //printf( "Adding exclusivity clause %d + %d.\n", Lits[0]-2*p->FirstVar, Lits[1]-2*p->FirstVar );
        }
        vLitsPrev = vLits;
    }
    // add inverters
    Vec_WecForEachLevel( p->vCuts, vCutOne, i )
        Vec_IntForEachEntry( vCutOne, Lit, k )
            if ( Abc_Lit2Var(Lit)-1 < p->nInputs ) // input
            {
                assert( k > 0 );
                Lits[0] = Abc_Var2Lit( Vec_WecSize(p->vObjCuts) + Abc_Lit2Var(Lit)-1, 0 );
                Lits[1] = Abc_Var2Lit( p->FirstVar + i, 1 );
                value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
                assert( value );
            }
            else // internal node
            {
                Lits[0] = Abc_Var2Lit( Lit-p->LitShift, 0 );
                Lits[1] = Abc_Var2Lit( p->FirstVar + i, 1 );
                value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
                assert( value );
            }

    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolar), Vec_IntSize(p->vPolar) );
    return 1;
}